

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

bool Internal_DimStyleHasFont
               (ON_ModelComponentReference *mcr,uint managed_font_sn,double model_space_text_scale,
               bool bIgnoreSystemDimStyles)

{
  bool bVar1;
  uint uVar2;
  ON_ModelComponent *p;
  ON_DimStyle *this;
  ON_Font *this_00;
  double dVar3;
  
  if (managed_font_sn == 0) {
    return false;
  }
  p = ON_ModelComponentReference::ModelComponent(mcr);
  this = ON_DimStyle::Cast(&p->super_ON_Object);
  if (this != (ON_DimStyle *)0x0) {
    this_00 = ON_DimStyle::Font(this);
    uVar2 = ON_Font::ManagedFontSerialNumber(this_00);
    if ((uVar2 == managed_font_sn) &&
       (((!bIgnoreSystemDimStyles ||
         (bVar1 = ON_ModelComponent::IsSystemComponent(&this->super_ON_ModelComponent), !bVar1)) &&
        (bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent), !bVar1)))) {
      if (0.0 < model_space_text_scale) {
        dVar3 = ON_DimStyle::DimScale(this);
        if (dVar3 != model_space_text_scale) {
          return false;
        }
        if (NAN(dVar3) || NAN(model_space_text_scale)) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

static bool Internal_DimStyleHasFont(
  const ON_ModelComponentReference& mcr,
  unsigned int managed_font_sn,
  double model_space_text_scale,
  bool bIgnoreSystemDimStyles
)
{
  for (;;)
  {
    if (0 == managed_font_sn)
      break;
    const ON_DimStyle* dim_style_component = ON_DimStyle::Cast(mcr.ModelComponent());
    if (nullptr == dim_style_component)
      break;
    if (managed_font_sn != dim_style_component->Font().ManagedFontSerialNumber())
      break; // wrong font
    if (bIgnoreSystemDimStyles && dim_style_component->IsSystemComponent())
      break; // no system components
    if (dim_style_component->ParentIdIsNotNil())
      break; // no overrides
    if (model_space_text_scale > 0.0 && !(model_space_text_scale == dim_style_component->DimScale()))
      break;
    return true;
  }
  return false;
}